

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void X86_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *in_RDI;
  
  MCRegisterInfo_InitMCRegisterInfo
            (in_RDI,X86RegDesc,0xea,0,0,X86MCRegisterClasses,0x4f,(uint16_t (*) [2])0x0,0,
             X86RegDiffLists,(char *)0x0,X86SubRegIdxLists,7,(uint16_t *)0x0);
  return;
}

Assistant:

void X86_init(MCRegisterInfo *MRI)
{
	/*
	   InitMCRegisterInfo(X86RegDesc, 234,
	   RA, PC,
	   X86MCRegisterClasses, 79,
	   X86RegUnitRoots, 119, X86RegDiffLists, X86RegStrings,
	   X86SubRegIdxLists, 7,
	   X86SubRegIdxRanges, X86RegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, X86RegDesc, 234,
			0, 0,
			X86MCRegisterClasses, 79,
			0, 0, X86RegDiffLists, 0,
			X86SubRegIdxLists, 7,
			0);
}